

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O1

bool __thiscall
TTD::ExecutionInfoManager::GetPreviousTimeAndPositionForDebugger
          (ExecutionInfoManager *this,TTDebuggerSourceLocation *sourceLocation)

{
  int iVar1;
  uint uVar2;
  SingleCallCounter *pSVar3;
  bool bVar4;
  FunctionBody *this_00;
  ULONG local_50;
  LONG local_4c;
  ULONG srcLine;
  LONG srcColumn;
  uint64 local_40;
  uint64 local_38;
  
  _srcLine = sourceLocation;
  pSVar3 = GetTopCallCounter(this);
  uVar2 = pSVar3->LastStatementIndex;
  if (uVar2 == 0xffffffff) {
    iVar1 = (this->m_callStack).
            super_ReadOnlyList<TTD::SingleCallCounter,_Memory::HeapAllocator,_DefaultComparer>.count
    ;
    bVar4 = iVar1 < 2;
    if (iVar1 < 2) {
      this_00 = pSVar3->Function;
      local_40 = pSVar3->FunctionTime;
      local_38 = pSVar3->CurrentStatementLoopTime;
      uVar2 = pSVar3->CurrentStatementIndex;
    }
    else {
      pSVar3 = JsUtil::ReadOnlyList<TTD::SingleCallCounter,_Memory::HeapAllocator,_DefaultComparer>
               ::Item(&(this->m_callStack).
                       super_ReadOnlyList<TTD::SingleCallCounter,_Memory::HeapAllocator,_DefaultComparer>
                      ,iVar1 + -2);
      this_00 = pSVar3->Function;
      local_40 = pSVar3->FunctionTime;
      uVar2 = pSVar3->CurrentStatementIndex;
      local_38 = pSVar3->CurrentStatementLoopTime;
    }
  }
  else {
    this_00 = pSVar3->Function;
    local_40 = pSVar3->FunctionTime;
    local_38 = pSVar3->LastStatementLoopTime;
    bVar4 = false;
  }
  local_50 = 0;
  local_4c = -1;
  uVar2 = Js::FunctionBody::GetStatementStartOffset(this_00,uVar2);
  Js::FunctionBody::GetSourceLineFromStartOffset_TTD(this_00,uVar2,&local_50,&local_4c);
  TTDebuggerSourceLocation::SetLocationFull
            (_srcLine,this->m_topLevelCallbackEventTime,local_40,local_38,this_00,local_50,local_4c)
  ;
  return bVar4;
}

Assistant:

bool ExecutionInfoManager::GetPreviousTimeAndPositionForDebugger(TTDebuggerSourceLocation& sourceLocation) const
    {
        bool noPrevious = false;
        const SingleCallCounter& cfinfo = this->GetTopCallCounter();

        //if we are at the first statement in the function then we want the parents current
        Js::FunctionBody* fbody = nullptr;
        int32 statementIndex = -1;
        uint64 ftime = 0;
        uint64 ltime = 0;
        if(cfinfo.LastStatementIndex == -1)
        {
            SingleCallCounter cfinfoCaller = { 0 };
            bool hasCaller = this->TryGetTopCallCallerCounter(cfinfoCaller);
            if (hasCaller)
            {
                ftime = cfinfoCaller.FunctionTime;
                ltime = cfinfoCaller.CurrentStatementLoopTime;

                fbody = cfinfoCaller.Function;
                statementIndex = cfinfoCaller.CurrentStatementIndex;
            }
            else
            {
                //Set the position info to the current statement and return true
                noPrevious = true;

                ftime = cfinfo.FunctionTime;
                ltime = cfinfo.CurrentStatementLoopTime;

                fbody = cfinfo.Function;
                statementIndex = cfinfo.CurrentStatementIndex;
            }
        }
        else
        {
            ftime = cfinfo.FunctionTime;
            ltime = cfinfo.LastStatementLoopTime;

            fbody = cfinfo.Function;
            statementIndex = cfinfo.LastStatementIndex;
        }

        ULONG srcLine = 0;
        LONG srcColumn = -1;
        uint32 startOffset = fbody->GetStatementStartOffset(statementIndex);
        fbody->GetSourceLineFromStartOffset_TTD(startOffset, &srcLine, &srcColumn);

        sourceLocation.SetLocationFull(this->m_topLevelCallbackEventTime, ftime, ltime, fbody, srcLine, srcColumn);

        return noPrevious;
    }